

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O2

int av1_get_skip_mode_context(MACROBLOCKD *xd)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0;
  uVar2 = 0;
  if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
    uVar2 = *(ushort *)&xd->above_mbmi->field_0xa7 >> 6 & 1;
  }
  if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
    uVar1 = *(ushort *)&xd->left_mbmi->field_0xa7 >> 6 & 1;
  }
  return uVar1 + uVar2;
}

Assistant:

static inline int av1_get_skip_mode_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  const int above_skip_mode = above_mi ? above_mi->skip_mode : 0;
  const int left_skip_mode = left_mi ? left_mi->skip_mode : 0;
  return above_skip_mode + left_skip_mode;
}